

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

IrRef ir_load_const(Trace *trace,int const_idx)

{
  IrRef IVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)const_idx;
  IVar1 = trace->const_loads[uVar2];
  if (IVar1 == 0) {
    IVar1 = ir_emit(trace,uVar2 * 0x10000 + 1);
    trace->const_loads[uVar2] = IVar1;
  }
  return IVar1;
}

Assistant:

static IrRef ir_load_const(Trace *trace, int const_idx) {
	if (trace->const_loads[const_idx] == IR_NONE) {
		// Emit a load constant instruction
		IrIns ins = ir_new1(IR_LOAD_CONST, (uint32_t) const_idx);
		IrRef load = ir_emit(trace, ins);
		trace->const_loads[const_idx] = load;
		return load;
	} else {
		// Return the index of the constant load instruction
		return trace->const_loads[const_idx];
	}
}